

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O3

void __thiscall
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::render
          (TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this,TagBit *tag,
          TagBit *end,SizeT offset,SizeT end_offset)

{
  uint new_capacity;
  StringStream<char> *this_00;
  char *pcVar1;
  SizeT SVar2;
  SizeT local_34;
  
  if (tag < end) {
    do {
      switch(tag->type_) {
      case Variable:
        renderVariable(this,(VariableTag *)tag->storage_,&local_34);
        break;
      case RawVariable:
        renderRawVariable(this,(VariableTag *)tag->storage_,&local_34);
        break;
      case Math:
        renderMath(this,(MathTag *)tag->storage_,&local_34);
        break;
      case SuperVariable:
        renderSuperVariable(this,(SuperVariableTag *)tag->storage_,&local_34);
        break;
      case InLineIf:
        renderInLineIf(this,(InLineIfTag *)tag->storage_,&local_34);
        break;
      case Loop:
        renderLoop(this,(LoopTag *)tag->storage_,&local_34);
        break;
      case If:
        renderIf(this,(IfTag *)tag->storage_,&local_34);
      }
      tag = tag + 1;
    } while (tag < end);
  }
  this_00 = this->stream_;
  pcVar1 = this->content_;
  SVar2 = this_00->length_;
  new_capacity = SVar2 + (end_offset - offset);
  if (this_00->capacity_ < new_capacity) {
    StringStream<char>::expand(this_00,new_capacity);
    SVar2 = this_00->length_;
  }
  Memory::Copy<unsigned_int>(this_00->storage_ + SVar2,pcVar1 + offset,end_offset - offset);
  this_00->length_ = new_capacity;
  return;
}

Assistant:

void render(const TagBit *tag, const TagBit *end, SizeT offset, SizeT end_offset) const {
        while (tag < end) {
            switch (tag->GetType()) {
                case TagType::Variable: {
                    renderVariable(tag->GetVariableTag(), offset);
                    break;
                }

                case TagType::RawVariable: {
                    renderRawVariable(tag->GetVariableTag(), offset);
                    break;
                }

                case TagType::Math: {
                    renderMath(tag->GetMathTag(), offset);
                    break;
                }

                case TagType::SuperVariable: {
                    renderSuperVariable(tag->GetSuperVariableTag(), offset);
                    break;
                }

                case TagType::InLineIf: {
                    renderInLineIf(tag->GetInLineIfTag(), offset);
                    break;
                }

                case TagType::Loop: {
                    renderLoop(tag->GetLoopTag(), offset);
                    break;
                }

                case TagType::If: {
                    renderIf(tag->GetIfTag(), offset);
                    break;
                }

                default: {
                }
            }

            ++tag;
        }

        stream_->Write((content_ + offset), (end_offset - offset));
    }